

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O3

t_object * xemmai::t_module::f_load_script(wstring_view a_path)

{
  _Elt_pointer *a_debug;
  _Elt_pointer *pptVar1;
  t_object *ptVar2;
  t_engine *this;
  t_type_of<xemmai::t_object> *this_00;
  t_queue<128UL> *this_01;
  t_queue<256UL> *this_02;
  FILE *__stream;
  t_script *ptVar3;
  t_object *ptVar4;
  wchar_t *in_RCX;
  size_t in_RSI;
  portable *in_RDI;
  long in_FS_OFFSET;
  wstring_view a_string;
  wstring_view a_path_00;
  wstring_view a_path_01;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_288;
  t_parser local_278;
  undefined1 local_1b8 [32];
  undefined2 local_198;
  _Rb_tree_node_base local_188;
  size_t local_168;
  _Rb_tree_node_base local_158;
  size_t local_138;
  _Rb_tree_node_base local_128;
  size_t local_108;
  pointer pptStack_100;
  pointer local_f8;
  pointer pptStack_f0;
  size_t local_e8;
  t_block *ptStack_e0;
  undefined2 local_d8;
  pointer local_d0;
  pointer ptStack_c8;
  pointer local_c0;
  pointer pptStack_b8;
  pointer local_b0;
  pointer pptStack_a8;
  pointer local_a0;
  pointer pptStack_98;
  pointer local_90;
  t_block *ptStack_88;
  undefined2 local_80;
  pointer local_78;
  pointer ptStack_70;
  pointer local_68;
  pointer pptStack_60;
  pointer local_58;
  pointer pptStack_50;
  pointer local_48;
  pointer pptStack_40;
  pointer local_38;
  
  a_string._M_str = in_RCX;
  a_string._M_len = in_RSI;
  portable::f_convert_abi_cxx11_((string *)local_1b8,in_RDI,a_string);
  __stream = fopen((char *)local_1b8._0_8_,"r");
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  ptVar4 = (t_object *)0x0;
  if (__stream != (FILE *)0x0) {
    local_188._M_left = &local_188;
    local_188._M_color = _S_red;
    local_188._M_parent = (_Base_ptr)0x0;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1b8._16_8_ = 0;
    local_1b8._24_8_ = 0;
    local_198._0_1_ = false;
    local_198._1_1_ = false;
    local_168 = 0;
    local_158._M_left = &local_158;
    local_158._M_color = _S_red;
    local_158._M_parent = (_Base_ptr)0x0;
    local_138 = 0;
    local_128._M_left = &local_128;
    local_128._M_color = _S_red;
    local_128._M_parent = (_Base_ptr)0x0;
    local_78 = (pointer)0x0;
    ptStack_70 = (pointer)0x0;
    local_68 = (pointer)0x0;
    pptStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    pptStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    pptStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    local_d8._0_1_ = false;
    local_d8._1_1_ = false;
    local_e8 = 0;
    ptStack_e0 = (t_block *)0x0;
    local_f8 = (pointer)0x0;
    pptStack_f0 = (pointer)0x0;
    local_108 = 0;
    pptStack_100 = (pointer)0x0;
    local_d0 = (pointer)0x0;
    ptStack_c8 = (pointer)0x0;
    local_c0 = (pointer)0x0;
    pptStack_b8 = (pointer)0x0;
    local_b0 = (pointer)0x0;
    pptStack_a8 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    pptStack_98 = (pointer)0x0;
    local_90 = (pointer)0x0;
    ptStack_88 = (t_block *)0x0;
    local_80._0_1_ = false;
    local_80._1_1_ = false;
    this = *(t_engine **)(in_FS_OFFSET + -0x60);
    this_00 = *(t_type_of<xemmai::t_object> **)(*(long *)(in_FS_OFFSET + -0x78) + 0x78);
    local_188._M_right = local_188._M_left;
    local_158._M_right = local_158._M_left;
    local_128._M_right = local_128._M_left;
    if (this->v_debugger == (t_debugger *)0x0) {
      ptVar3 = (t_script *)
               t_type_of<xemmai::t_object>::
               f_new<xemmai::t_script,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&>
                         (this_00,&local_288);
      local_278.v_module =
           (t_script *)
           &(ptVar3->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
      a_path_01._M_str =
           (wchar_t *)
           (ptVar3->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
      a_path_01._M_len =
           (size_t)(ptVar3->v_slots).
                   super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
      t_lexer::t_lexer(&local_278.v_lexer,a_path_01,(FILE *)__stream);
      local_278.v_can_jump = false;
      local_278.v_can_return = false;
      t_parser::operator()(&local_278,(t_scope *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_278.v_lexer.v_path._M_dataplus._M_p != &local_278.v_lexer.v_path.field_2) {
        operator_delete(local_278.v_lexer.v_path._M_dataplus._M_p,
                        local_278.v_lexer.v_path.field_2._M_allocated_capacity * 4 + 4);
      }
      local_278.v_lexer.v_path._M_dataplus._M_p = (pointer)0x0;
      local_278.v_module = ptVar3;
      ptVar4 = t_emit::operator()((t_emit *)&local_278,(t_scope *)local_1b8);
    }
    else {
      ptVar3 = (t_script *)
               t_type_of<xemmai::t_object>::
               f_new<xemmai::t_debug_script,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&>
                         (this_00,&local_288);
      a_debug = &(ptVar3->v_slots).
                 super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last;
      a_path_00._M_str =
           (wchar_t *)
           (ptVar3->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
      a_path_00._M_len =
           (size_t)(ptVar3->v_slots).
                   super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
      local_278.v_module = (t_script *)a_debug;
      t_lexer::t_lexer(&local_278.v_lexer,a_path_00,(FILE *)__stream);
      local_278.v_can_jump = false;
      local_278.v_can_return = false;
      t_parser::operator()(&local_278,(t_scope *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_278.v_lexer.v_path._M_dataplus._M_p != &local_278.v_lexer.v_path.field_2) {
        operator_delete(local_278.v_lexer.v_path._M_dataplus._M_p,
                        local_278.v_lexer.v_path.field_2._M_allocated_capacity * 4 + 4);
      }
      local_278.v_lexer.v_path._M_dataplus._M_p =
           (pointer)&ptVar3[1].v_slots.
                     super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                     super__Deque_impl_data._M_start._M_node;
      local_278.v_module = ptVar3;
      ptVar4 = t_emit::operator()((t_emit *)&local_278,(t_scope *)local_1b8);
      if ((t_object *)0x4 < ptVar4) {
        this_01 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
        *this_01->v_head = ptVar4;
        if (this_01->v_head == this_01->v_next) {
          t_slot::t_queue<128UL>::f_next(this_01);
        }
        else {
          this_01->v_head = this_01->v_head + 1;
        }
      }
      LOCK();
      pptVar1 = &ptVar3[1].v_slots.
                 super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last;
      ptVar2 = (t_object *)*pptVar1;
      *pptVar1 = (_Elt_pointer)ptVar4;
      UNLOCK();
      if ((t_object *)0x4 < ptVar2) {
        this_02 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
        *this_02->v_head = ptVar2;
        if (this_02->v_head == this_02->v_next) {
          t_slot::t_queue<256UL>::f_next(this_02);
        }
        else {
          this_02->v_head = this_02->v_head + 1;
        }
      }
      t_engine::f_debug_script_loaded(this,(t_debug_script *)a_debug);
      ptVar4 = (t_object *)
               ptVar3[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
    }
    ast::t_scope::~t_scope((t_scope *)local_1b8);
    fclose(__stream);
  }
  return ptVar4;
}

Assistant:

t_object* t_module::f_load_script(std::wstring_view a_path)
{
	auto stream = std::fopen(portable::f_convert(a_path).c_str(), "r");
	if (!stream) return nullptr;
	std::unique_ptr<std::FILE, int(*)(std::FILE*)> close(stream, std::fclose);
	ast::t_scope scope(nullptr);
	if (auto engine = f_engine(); engine->v_debugger) {
		auto body = f_global()->f_type<t_module::t_body>()->f_new<t_debug_script>(a_path);
		auto& script = body->f_as<t_debug_script>();
		t_parser(script, stream)(scope);
		script.v_code = t_emit(body, &script.v_safe_points)(scope);
		engine->f_debug_script_loaded(script);
		return script.v_code;
	} else {
		auto body = f_global()->f_type<t_module::t_body>()->f_new<t_script>(a_path);
		t_parser(body->f_as<t_script>(), stream)(scope);
		return t_emit(body, nullptr)(scope);
	}
}